

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringClass.cpp
# Opt level: O0

char * dirname(char *__path)

{
  int iVar1;
  char *pcVar2;
  String *in_RSI;
  int lastpos;
  String *path_local;
  
  iVar1 = String::lastIndexOf(in_RSI,"/",-1);
  if (iVar1 < 1) {
    pcVar2 = String::operator_cast_to_char_(in_RSI);
    if (*pcVar2 == '/') {
      String::String((String *)__path,"/");
    }
    else {
      String::String((String *)__path,"");
    }
  }
  else {
    String::mid((String *)__path,in_RSI,0,(long)iVar1);
  }
  return __path;
}

Assistant:

String dirname (String const& path)
{
	int lastpos = path.lastIndexOf (DIRSLASH);

	if (lastpos > 0)
		return path.mid (0, lastpos);

#ifndef _WIN32
	if (path[0] == '/')
		return "/";
#endif // _WIN32

	return "";
}